

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O2

int lj_cf_debug_getlocal(lua_State *L)

{
  TValue *pTVar1;
  int32_t n;
  int32_t level;
  int iVar2;
  char *pcVar3;
  int iVar4;
  lua_State *L_00;
  uint uVar5;
  lua_Debug ar;
  
  pTVar1 = L->base;
  uVar5 = 0;
  L_00 = L;
  if ((pTVar1 < L->top) && ((pTVar1->field_2).it == 0xfffffff9)) {
    uVar5 = 1;
    L_00 = (lua_State *)(ulong)(pTVar1->u32).lo;
  }
  iVar4 = 1;
  n = lj_lib_checkint(L,uVar5 + 2);
  if (*(int *)((long)L->base + (ulong)uVar5 * 8 + 4) == -9) {
    L->top = L->base + (ulong)uVar5 + 1;
    pcVar3 = lua_getlocal(L,(lua_Debug *)0x0,n);
    lua_pushstring(L,pcVar3);
  }
  else {
    level = lj_lib_checkint(L,uVar5 + 1);
    iVar2 = lua_getstack(L_00,level,&ar);
    if (iVar2 == 0) {
      lj_err_arg(L,uVar5 + 1,LJ_ERR_LVLRNG);
    }
    pcVar3 = lua_getlocal(L_00,&ar,n);
    if (pcVar3 == (char *)0x0) {
      *(undefined4 *)((long)L->top + -4) = 0xffffffff;
    }
    else {
      lua_xmove(L_00,L,1);
      lua_pushstring(L,pcVar3);
      lua_pushvalue(L,-2);
      iVar4 = 2;
    }
  }
  return iVar4;
}

Assistant:

LJLIB_CF(debug_getlocal)
{
  int arg;
  lua_State *L1 = getthread(L, &arg);
  lua_Debug ar;
  const char *name;
  int slot = lj_lib_checkint(L, arg+2);
  if (tvisfunc(L->base+arg)) {
    L->top = L->base+arg+1;
    lua_pushstring(L, lua_getlocal(L, NULL, slot));
    return 1;
  }
  if (!lua_getstack(L1, lj_lib_checkint(L, arg+1), &ar))
    lj_err_arg(L, arg+1, LJ_ERR_LVLRNG);
  name = lua_getlocal(L1, &ar, slot);
  if (name) {
    lua_xmove(L1, L, 1);
    lua_pushstring(L, name);
    lua_pushvalue(L, -2);
    return 2;
  } else {
    setnilV(L->top-1);
    return 1;
  }
}